

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void dealDoubleEdge(void)

{
  int iVar1;
  pointer ppVar2;
  pointer ppVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int __tmp;
  size_type __new_size;
  
  fprintf(_stderr,"number of edges before dealDoubleEdge: %lu\n",
          (long)edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppVar3 = edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  if (edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar5 = 0;
    do {
      iVar1 = ppVar2[lVar5].first;
      if (ppVar2[lVar5].second < iVar1) {
        ppVar2[lVar5].first = ppVar2[lVar5].second;
        ppVar2[lVar5].second = iVar1;
      }
      lVar5 = lVar5 + 1;
    } while (uVar4 + (uVar4 == 0) != lVar5);
  }
  if (ppVar2 != ppVar3) {
    lVar5 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar2,ppVar3,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar2,ppVar3);
  }
  ppVar2 = edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar4 < 2) {
    __new_size = 1;
  }
  else {
    uVar6 = 1;
    __new_size = uVar6;
    do {
      iVar1 = ppVar2[uVar6].second;
      if ((ppVar2[uVar6].first != ppVar2[uVar6 - 1].first) || (iVar1 != ppVar2[uVar6 - 1].second)) {
        ppVar2[__new_size].first = ppVar2[uVar6].first;
        ppVar2[__new_size].second = iVar1;
        __new_size = __new_size + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize(&edges,__new_size)
  ;
  fprintf(_stderr,"number of edges after dealDoubleEdge: %lu\n",
          (long)edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
  return;
}

Assistant:

void dealDoubleEdge() {
	fprintf(stderr, "number of edges before dealDoubleEdge: %lu\n", edges.size());
	// 排序
	for (size_t i = 0; i < edges.size(); i++) {
		if (edges[i].first > edges[i].second) swap(edges[i].first, edges[i].second);
	}
	sort(edges.begin(), edges.end());
	// 去重
	size_t cur = 1;
	for (size_t last = 0, i = 1; i < edges.size(); ++i, last = i-1) {
		if (edges[i] != edges[last]) {
			edges[cur++] = edges[i];
		}
	}
	edges.resize(cur);
	fprintf(stderr, "number of edges after dealDoubleEdge: %lu\n", edges.size());
}